

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O0

void __thiscall NotFoundException::~NotFoundException(NotFoundException *this)

{
  NotFoundException *in_RDI;
  
  ~NotFoundException(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

NotFoundException(string name) {
        this->error_message = name + " is not found";
    }